

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LayerShapeConstraints.cpp
# Opt level: O2

void __thiscall CoreML::ShapeConstraint::updateWidthRange(ShapeConstraint *this,ShapeRange *other)

{
  string err;
  
  ShapeRange::intersect((ShapeRange *)&err,&this->_widthRange,other);
  *(size_type *)&(this->_widthRange)._maximum = err.field_2._M_allocated_capacity;
  (this->_widthRange)._maximum._val = err.field_2._8_8_;
  *(pointer *)&(this->_widthRange)._minimum = err._M_dataplus._M_p;
  (this->_widthRange)._minimum._val = err._M_string_length;
  return;
}

Assistant:

void ShapeConstraint::updateWidthRange(const ShapeRange& other) {
    try {
        _widthRange = _widthRange.intersect(other);
    }
    catch (std::runtime_error& e) {
        std::string err = "Invalid width range in blob " + _name + ". " + e.what();
        throw std::runtime_error(err);
    }
}